

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef
BinaryenCallIndirectGetOperandAt(BinaryenExpressionRef expr,BinaryenIndex index)

{
  if (expr->_id != CallIndirectId) {
    __assert_fail("expression->is<CallIndirect>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x92e,
                  "BinaryenExpressionRef BinaryenCallIndirectGetOperandAt(BinaryenExpressionRef, BinaryenIndex)"
                 );
  }
  if ((ulong)index < *(ulong *)(expr + 2)) {
    return *(BinaryenExpressionRef *)(expr[1].type.id + (ulong)index * 8);
  }
  __assert_fail("index < static_cast<CallIndirect*>(expression)->operands.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x92f,
                "BinaryenExpressionRef BinaryenCallIndirectGetOperandAt(BinaryenExpressionRef, BinaryenIndex)"
               );
}

Assistant:

BinaryenExpressionRef
BinaryenCallIndirectGetOperandAt(BinaryenExpressionRef expr,
                                 BinaryenIndex index) {
  auto* expression = (Expression*)expr;
  assert(expression->is<CallIndirect>());
  assert(index < static_cast<CallIndirect*>(expression)->operands.size());
  return static_cast<CallIndirect*>(expression)->operands[index];
}